

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::divRegFromRegUnsigned
               (CodeGen *codeGen,Registers dest,Registers src,bool is32bits)

{
  Registers local_16;
  value_type_conflict1 local_15 [3];
  Registers local_12;
  Registers local_11;
  bool is32bits_local;
  Registers src_local;
  CodeGen *pCStack_10;
  Registers dest_local;
  CodeGen *codeGen_local;
  
  local_15[2] = is32bits;
  local_12 = src;
  local_11 = dest;
  pCStack_10 = codeGen;
  if (dest != AX) {
    __assert_fail("dest == Registers::AX && \"Only the AX register is supported as dest.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/compiler/x64/amd64.cpp"
                  ,0x447,
                  "void stackjit::Amd64Backend::divRegFromRegUnsigned(CodeGen &, Registers, Registers, bool)"
                 );
  }
  if (!is32bits) {
    local_15[1] = 0x48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(codeGen,local_15 + 1);
  }
  local_15[0] = 0xf7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,local_15);
  local_16 = local_12 | 0xf0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pCStack_10,&local_16);
  return;
}

Assistant:

void Amd64Backend::divRegFromRegUnsigned(CodeGen& codeGen, Registers dest, Registers src, bool is32bits) {
		assert(dest == Registers::AX && "Only the AX register is supported as dest.");

		if (!is32bits) {
			codeGen.push_back(0x48);
		}

		codeGen.push_back(0xf7);
		codeGen.push_back(0xf0 | (Byte)src);
	}